

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O0

pid_t start_process(char **argv)

{
  __pid_t __pgid;
  __pid_t _Var1;
  int iVar2;
  char **in_RDI;
  pid_t pid;
  pid_t parent_pid;
  
  __pgid = getpid();
  _Var1 = fork();
  if (_Var1 == 0) {
    iVar2 = setpgid(0,__pgid);
    if (iVar2 == -1) {
      throw((char *)0x1028f0);
    }
    iVar2 = execv(*in_RDI,in_RDI);
    if (iVar2 == -1) {
      throw((char *)0x102913);
    }
  }
  return _Var1;
}

Assistant:

pid_t start_process(char *argv[]) {
	// Will need to set the group id
	const pid_t parent_pid = getpid();
	const pid_t pid = fork();

	if (pid == 0) {
		// Set group id of the children so that we
		// can send around signals
		if (setpgid(pid, parent_pid) == -1) {
			throw("Could not set group id for child process");
		}
		// Replace the current process with the command
		// we want to execute (child or server)
		// First argument is the command to call,
		// second is an array of arguments, where the
		// command path has to be included as well
		// (that's why argv[0] first)
		if (execv(argv[0], argv) == -1) {
			throw("Error opening child process");
		}
	}

	return pid;
}